

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::StructBuilderArgs
          (PythonGenerator *this,StructDef *struct_def,string *nameprefix,string *namesuffix,
          bool has_field_name,string *fieldname_suffix,string *code_ptr)

{
  FieldDef *pFVar1;
  pointer pcVar2;
  StructDef *struct_def_00;
  BaseType BVar3;
  long *plVar4;
  long *plVar5;
  pointer ppFVar6;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  PythonGenerator *local_d0;
  string *local_c8;
  IdlNamer *local_c0;
  string local_b8;
  string local_98;
  string local_78;
  StructDef *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  ppFVar6 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar6 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_c0 = &this->namer_;
    local_d0 = this;
    local_c8 = fieldname_suffix;
    local_58 = struct_def;
    do {
      pFVar1 = *ppFVar6;
      BVar3 = (pFVar1->value).type.base_type;
      if (BVar3 == BASE_TYPE_ARRAY) {
        BVar3 = (pFVar1->value).type.element;
      }
      if ((BVar3 == BASE_TYPE_STRUCT) && (((pFVar1->value).type.struct_def)->fixed == true)) {
        pcVar2 = (nameprefix->_M_dataplus)._M_p;
        local_110 = &local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar2,pcVar2 + nameprefix->_M_string_length);
        if (has_field_name) {
          (*(local_c0->super_Namer)._vptr_Namer[0x12])(local_50,local_c0,pFVar1);
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_50,(ulong)(local_c8->_M_dataplus)._M_p);
          local_f0 = &local_e0;
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_e0 = *plVar5;
            lStack_d8 = plVar4[3];
          }
          else {
            local_e0 = *plVar5;
            local_f0 = (long *)*plVar4;
          }
          local_e8 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,local_e0 + 1);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
        struct_def_00 = (pFVar1->value).type.struct_def;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_110,local_108 + (long)local_110);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        pcVar2 = (namesuffix->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar2,pcVar2 + namesuffix->_M_string_length);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar2 = (local_c8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar2,pcVar2 + local_c8->_M_string_length);
        StructBuilderArgs(local_d0,struct_def_00,&local_98,&local_b8,has_field_name,&local_78,
                          code_ptr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
      }
      else {
        local_f0 = &local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,", ","");
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_f0,(ulong)(nameprefix->_M_dataplus)._M_p);
        local_110 = &local_100;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_100 = *plVar5;
          lStack_f8 = plVar4[3];
        }
        else {
          local_100 = *plVar5;
          local_110 = (long *)*plVar4;
        }
        local_108 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (has_field_name) {
          (*(local_c0->super_Namer)._vptr_Namer[0x12])(&local_110,local_c0,pFVar1);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_110);
          if (local_110 != &local_100) {
            operator_delete(local_110,local_100 + 1);
          }
        }
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)(namesuffix->_M_dataplus)._M_p);
      }
      ppFVar6 = ppFVar6 + 1;
    } while (ppFVar6 !=
             (local_58->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void StructBuilderArgs(const StructDef &struct_def,
                         const std::string nameprefix,
                         const std::string namesuffix, bool has_field_name,
                         const std::string fieldname_suffix,
                         std::string *code_ptr) const {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto &type =
          IsArray(field_type) ? field_type.VectorType() : field_type;
      if (IsStruct(type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        auto subprefix = nameprefix;
        if (has_field_name) {
          subprefix += namer_.Field(field) + fieldname_suffix;
        }
        StructBuilderArgs(*field.value.type.struct_def, subprefix, namesuffix,
                          has_field_name, fieldname_suffix, code_ptr);
      } else {
        auto &code = *code_ptr;
        code += std::string(", ") + nameprefix;
        if (has_field_name) { code += namer_.Field(field); }
        code += namesuffix;
      }
    }
  }